

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O3

size_t ZSTD_compressBlock_doubleFast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong *puVar5;
  int *piVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  BYTE *pBVar9;
  ulong *puVar10;
  uint uVar11;
  BYTE *pBVar12;
  U32 *pUVar13;
  U32 *pUVar14;
  bool bVar15;
  undefined8 uVar16;
  uint uVar17;
  BYTE *litEnd;
  ulong uVar18;
  byte bVar19;
  byte bVar20;
  ulong *puVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  ulong *puVar25;
  ulong uVar26;
  ulong *puVar27;
  uint uVar28;
  ulong uVar29;
  int iVar30;
  BYTE *pStart_3;
  ulong *puVar31;
  ulong *puVar32;
  BYTE *pBVar33;
  ulong uVar34;
  int iVar35;
  BYTE *pBVar36;
  long lVar37;
  ulong *puVar38;
  BYTE *litEnd_1;
  uint uVar39;
  U32 UVar40;
  uint uVar41;
  BYTE *litEnd_3;
  ulong uVar42;
  seqDef *psVar43;
  uint uVar44;
  ulong uVar45;
  U32 *hashSmall;
  BYTE *litLimit_w;
  BYTE *iend;
  BYTE *litLimit_w_9;
  BYTE *base;
  BYTE *prefixLowest;
  U32 *hashLong;
  BYTE *ilimit;
  U32 prefixLowestIndex;
  
  pBVar12 = (ms->window).base;
  puVar5 = (ulong *)((long)src + srcSize);
  iVar30 = (int)pBVar12;
  iVar35 = (int)puVar5 - iVar30;
  uVar11 = (ms->window).dictLimit;
  uVar28 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar17 = iVar35 - uVar28;
  if (iVar35 - uVar11 <= uVar28) {
    uVar17 = uVar11;
  }
  if (ms->loadedDictEnd != 0) {
    uVar17 = uVar11;
  }
  pBVar36 = pBVar12 + uVar17;
  puVar25 = (ulong *)((ulong)((int)src == (int)pBVar36) + (long)src);
  iVar35 = (int)puVar25 - iVar30;
  uVar39 = iVar35 - uVar28;
  if (iVar35 - uVar11 <= uVar28) {
    uVar39 = uVar11;
  }
  puVar10 = (ulong *)((long)src + (srcSize - 8));
  if (ms->loadedDictEnd != 0) {
    uVar39 = uVar11;
  }
  uVar11 = *rep;
  uVar28 = rep[1];
  uVar39 = iVar35 - uVar39;
  uVar41 = uVar28;
  if (uVar39 < uVar28) {
    uVar41 = 0;
  }
  uVar29 = (ulong)uVar41;
  uVar44 = 0;
  if (uVar11 <= uVar39) {
    uVar44 = uVar11;
  }
  uVar45 = (ulong)uVar44;
  uVar22 = (ms->cParams).minMatch;
  pUVar13 = ms->hashTable;
  pUVar14 = ms->chainTable;
  if (uVar22 == 5) {
    if (puVar25 < puVar10) {
      bVar19 = 0x40 - (char)(ms->cParams).hashLog;
      bVar20 = 0x40 - (char)(ms->cParams).chainLog;
      puVar1 = (ulong *)((long)puVar5 - 7);
      puVar2 = (ulong *)((long)puVar5 - 3);
      puVar3 = (ulong *)((long)puVar5 - 1);
      puVar4 = puVar5 + -4;
LAB_005d108f:
      uVar26 = *puVar25;
      uVar18 = uVar26 * -0x30e44323485a9b9d >> (bVar19 & 0x3f);
      uVar23 = uVar26 * -0x30e4432345000000 >> (bVar20 & 0x3f);
      UVar40 = (int)puVar25 - iVar30;
      uVar41 = pUVar13[uVar18];
      uVar34 = (ulong)uVar41;
      uVar44 = pUVar14[uVar23];
      uVar42 = (ulong)uVar44;
      pUVar14[uVar23] = UVar40;
      pUVar13[uVar18] = UVar40;
      puVar27 = (ulong *)((long)puVar25 + 1);
      uVar22 = (uint)uVar45;
      if ((uVar22 != 0) && (*(int *)((long)puVar27 - uVar45) == *(int *)((long)puVar25 + 1))) {
        lVar24 = -uVar45;
        puVar32 = (ulong *)((long)puVar25 + 5);
        puVar31 = (ulong *)((long)puVar25 + lVar24 + 5);
        puVar38 = puVar32;
        if (puVar32 < puVar1) {
          if (*puVar31 == *puVar32) {
            lVar37 = 0;
            do {
              puVar38 = (ulong *)((long)puVar25 + lVar37 + 0xd);
              if (puVar1 <= puVar38) {
                puVar31 = (ulong *)((long)puVar25 + lVar24 + lVar37 + 0xd);
                puVar38 = (ulong *)((long)puVar25 + lVar37 + 0xd);
                goto LAB_005d1371;
              }
              uVar26 = *(ulong *)((long)puVar25 + lVar37 + lVar24 + 0xd);
              uVar18 = *puVar38;
              lVar37 = lVar37 + 8;
            } while (uVar26 == uVar18);
            uVar18 = uVar18 ^ uVar26;
            uVar26 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
              }
            }
            uVar26 = (uVar26 >> 3 & 0x1fffffff) + lVar37;
          }
          else {
            uVar18 = *puVar32 ^ *puVar31;
            uVar26 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
              }
            }
            uVar26 = uVar26 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_005d1371:
          if ((puVar38 < puVar2) && ((int)*puVar31 == (int)*puVar38)) {
            puVar38 = (ulong *)((long)puVar38 + 4);
            puVar31 = (ulong *)((long)puVar31 + 4);
          }
          if ((puVar38 < puVar3) && ((short)*puVar31 == (short)*puVar38)) {
            puVar38 = (ulong *)((long)puVar38 + 2);
            puVar31 = (ulong *)((long)puVar31 + 2);
          }
          if (puVar38 < puVar5) {
            puVar38 = (ulong *)((long)puVar38 + (ulong)((char)*puVar31 == (char)*puVar38));
          }
          uVar26 = (long)puVar38 - (long)puVar32;
        }
        uVar18 = (long)puVar27 - (long)src;
        puVar25 = (ulong *)seqStore->lit;
        if (puVar4 < puVar27) {
          puVar32 = puVar25;
          puVar38 = (ulong *)src;
          if (src <= puVar4) {
            puVar32 = (ulong *)((long)puVar25 + ((long)puVar4 - (long)src));
            uVar23 = *(ulong *)((long)src + 8);
            *puVar25 = *src;
            puVar25[1] = uVar23;
            puVar38 = puVar4;
            if (0x10 < (long)puVar4 - (long)src) {
              lVar24 = 0x10;
              do {
                uVar16 = ((undefined8 *)((long)src + lVar24))[1];
                puVar7 = (undefined8 *)((long)puVar25 + lVar24);
                *puVar7 = *(undefined8 *)((long)src + lVar24);
                puVar7[1] = uVar16;
                puVar8 = (undefined8 *)((long)src + lVar24 + 0x10);
                uVar16 = puVar8[1];
                puVar7[2] = *puVar8;
                puVar7[3] = uVar16;
                lVar24 = lVar24 + 0x20;
              } while (puVar7 + 4 < puVar32);
            }
          }
          if (puVar38 < puVar27) {
            lVar24 = 0;
            do {
              *(undefined1 *)((long)puVar32 + lVar24) = *(undefined1 *)((long)puVar38 + lVar24);
              lVar24 = lVar24 + 1;
            } while ((long)puVar27 - (long)puVar38 != lVar24);
          }
LAB_005d1491:
          seqStore->lit = seqStore->lit + uVar18;
          psVar43 = seqStore->sequences;
          if (0xffff < uVar18) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar43 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar23 = *(ulong *)((long)src + 8);
          *puVar25 = *src;
          puVar25[1] = uVar23;
          pBVar33 = seqStore->lit;
          if (0x10 < uVar18) {
            uVar23 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar33 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar33 + 0x18) = uVar23;
            if (0x20 < (long)uVar18) {
              lVar24 = 0;
              do {
                puVar7 = (undefined8 *)((long)src + lVar24 + 0x20);
                uVar16 = puVar7[1];
                pBVar9 = pBVar33 + lVar24 + 0x20;
                *(undefined8 *)pBVar9 = *puVar7;
                *(undefined8 *)(pBVar9 + 8) = uVar16;
                puVar7 = (undefined8 *)((long)src + lVar24 + 0x30);
                uVar16 = puVar7[1];
                *(undefined8 *)(pBVar9 + 0x10) = *puVar7;
                *(undefined8 *)(pBVar9 + 0x18) = uVar16;
                lVar24 = lVar24 + 0x20;
              } while (pBVar9 + 0x20 < pBVar33 + uVar18);
            }
            goto LAB_005d1491;
          }
          seqStore->lit = pBVar33 + uVar18;
          psVar43 = seqStore->sequences;
        }
        lVar24 = uVar26 + 4;
        uVar26 = uVar26 + 1;
        psVar43->litLength = (U16)uVar18;
        psVar43->offset = 1;
        goto joined_r0x005d14e1;
      }
      if ((uVar17 < uVar41) && (puVar32 = (ulong *)(pBVar12 + uVar34), *puVar32 == uVar26)) {
        puVar27 = puVar25 + 1;
        puVar38 = puVar32 + 1;
        puVar31 = puVar27;
        if (puVar27 < puVar1) {
          if (*puVar38 == *puVar27) {
            lVar24 = 0;
            do {
              puVar38 = (ulong *)((long)puVar25 + lVar24 + 0x10);
              if (puVar1 <= puVar38) {
                puVar38 = (ulong *)(pBVar12 + lVar24 + uVar34 + 0x10);
                puVar31 = (ulong *)((long)puVar25 + lVar24 + 0x10);
                goto LAB_005d179b;
              }
              lVar37 = lVar24 + uVar34 + 0x10;
              uVar29 = *puVar38;
              lVar24 = lVar24 + 8;
            } while (*(ulong *)(pBVar12 + lVar37) == uVar29);
            uVar29 = uVar29 ^ *(ulong *)(pBVar12 + lVar37);
            uVar26 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
              }
            }
            uVar29 = (uVar26 >> 3 & 0x1fffffff) + lVar24;
          }
          else {
            uVar26 = *puVar27 ^ *puVar38;
            uVar29 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
              }
            }
            uVar29 = uVar29 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_005d179b:
          if ((puVar31 < puVar2) && ((int)*puVar38 == (int)*puVar31)) {
            puVar31 = (ulong *)((long)puVar31 + 4);
            puVar38 = (ulong *)((long)puVar38 + 4);
          }
          if ((puVar31 < puVar3) && ((short)*puVar38 == (short)*puVar31)) {
            puVar31 = (ulong *)((long)puVar31 + 2);
            puVar38 = (ulong *)((long)puVar38 + 2);
          }
          if (puVar31 < puVar5) {
            puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar38 == (char)*puVar31));
          }
          uVar29 = (long)puVar31 - (long)puVar27;
        }
        lVar24 = uVar29 + 8;
        uVar18 = (long)puVar25 - (long)puVar32;
        puVar27 = puVar25;
        if (src < puVar25) {
          pBVar33 = pBVar12 + (uVar34 - 1);
          puVar25 = (ulong *)((long)puVar25 + -1);
          do {
            if ((BYTE)*puVar25 != *pBVar33) goto LAB_005d18c9;
            lVar24 = lVar24 + 1;
            puVar27 = (ulong *)((long)puVar25 + -1);
          } while ((pBVar36 < pBVar33) &&
                  (pBVar33 = pBVar33 + -1, bVar15 = src < puVar25, puVar25 = puVar27, bVar15));
LAB_005d18c4:
          puVar27 = (ulong *)((long)puVar27 + 1);
        }
        goto LAB_005d18d4;
      }
      if ((uVar17 < uVar44) && (piVar6 = (int *)(pBVar12 + uVar42), *piVar6 == (int)*puVar25)) {
        uVar29 = *puVar27;
        uVar26 = uVar29 * -0x30e44323485a9b9d >> (bVar19 & 0x3f);
        uVar41 = pUVar13[uVar26];
        uVar23 = (ulong)uVar41;
        pUVar13[uVar26] = UVar40 + 1;
        if ((uVar17 < uVar41) && (puVar32 = (ulong *)(pBVar12 + uVar23), *puVar32 == uVar29)) {
          puVar38 = (ulong *)((long)puVar25 + 9);
          puVar31 = puVar32 + 1;
          puVar21 = puVar38;
          if (puVar38 < puVar1) {
            if (*puVar31 == *puVar38) {
              lVar24 = 0;
              do {
                puVar31 = (ulong *)((long)puVar25 + lVar24 + 0x11);
                if (puVar1 <= puVar31) {
                  puVar31 = (ulong *)(pBVar12 + lVar24 + uVar23 + 0x10);
                  puVar21 = (ulong *)((long)puVar25 + lVar24 + 0x11);
                  goto LAB_005d1a38;
                }
                lVar37 = lVar24 + uVar23 + 0x10;
                uVar29 = *puVar31;
                lVar24 = lVar24 + 8;
              } while (*(ulong *)(pBVar12 + lVar37) == uVar29);
              uVar29 = uVar29 ^ *(ulong *)(pBVar12 + lVar37);
              uVar26 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                }
              }
              uVar29 = (uVar26 >> 3 & 0x1fffffff) + lVar24;
            }
            else {
              uVar26 = *puVar38 ^ *puVar31;
              uVar29 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                }
              }
              uVar29 = uVar29 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_005d1a38:
            if ((puVar21 < puVar2) && ((int)*puVar31 == (int)*puVar21)) {
              puVar21 = (ulong *)((long)puVar21 + 4);
              puVar31 = (ulong *)((long)puVar31 + 4);
            }
            if ((puVar21 < puVar3) && ((short)*puVar31 == (short)*puVar21)) {
              puVar21 = (ulong *)((long)puVar21 + 2);
              puVar31 = (ulong *)((long)puVar31 + 2);
            }
            if (puVar21 < puVar5) {
              puVar21 = (ulong *)((long)puVar21 + (ulong)((char)*puVar31 == (char)*puVar21));
            }
            uVar29 = (long)puVar21 - (long)puVar38;
          }
          lVar24 = uVar29 + 8;
          uVar18 = (long)puVar27 - (long)puVar32;
          if (src < puVar27) {
            pBVar33 = pBVar12 + (uVar23 - 1);
            while (puVar27 = puVar25, (BYTE)*puVar27 == *pBVar33) {
              lVar24 = lVar24 + 1;
              if ((pBVar33 <= pBVar36) ||
                 (pBVar33 = pBVar33 + -1, puVar25 = (ulong *)((long)puVar27 + -1), puVar27 <= src))
              goto LAB_005d18d4;
            }
            puVar27 = (ulong *)((long)puVar27 + 1);
          }
        }
        else {
          puVar27 = (ulong *)((long)puVar25 + 4);
          puVar32 = (ulong *)(piVar6 + 1);
          puVar38 = puVar27;
          if (puVar27 < puVar1) {
            if (*puVar32 == *puVar27) {
              lVar24 = 0;
              do {
                puVar32 = (ulong *)((long)puVar25 + lVar24 + 0xc);
                if (puVar1 <= puVar32) {
                  puVar32 = (ulong *)(pBVar12 + lVar24 + uVar42 + 0xc);
                  puVar38 = (ulong *)((long)puVar25 + lVar24 + 0xc);
                  goto LAB_005d1844;
                }
                lVar37 = lVar24 + uVar42 + 0xc;
                uVar29 = *puVar32;
                lVar24 = lVar24 + 8;
              } while (*(ulong *)(pBVar12 + lVar37) == uVar29);
              uVar29 = uVar29 ^ *(ulong *)(pBVar12 + lVar37);
              uVar26 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                }
              }
              uVar29 = (uVar26 >> 3 & 0x1fffffff) + lVar24;
            }
            else {
              uVar26 = *puVar27 ^ *puVar32;
              uVar29 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                }
              }
              uVar29 = uVar29 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_005d1844:
            if ((puVar38 < puVar2) && ((int)*puVar32 == (int)*puVar38)) {
              puVar38 = (ulong *)((long)puVar38 + 4);
              puVar32 = (ulong *)((long)puVar32 + 4);
            }
            if ((puVar38 < puVar3) && ((short)*puVar32 == (short)*puVar38)) {
              puVar38 = (ulong *)((long)puVar38 + 2);
              puVar32 = (ulong *)((long)puVar32 + 2);
            }
            if (puVar38 < puVar5) {
              puVar38 = (ulong *)((long)puVar38 + (ulong)((char)*puVar32 == (char)*puVar38));
            }
            uVar29 = (long)puVar38 - (long)puVar27;
          }
          lVar24 = uVar29 + 4;
          uVar18 = (long)puVar25 - (long)piVar6;
          puVar27 = puVar25;
          if (src < puVar25) {
            pBVar33 = pBVar12 + (uVar42 - 1);
            puVar25 = (ulong *)((long)puVar25 + -1);
            do {
              if ((BYTE)*puVar25 != *pBVar33) goto LAB_005d18c9;
              lVar24 = lVar24 + 1;
              puVar27 = (ulong *)((long)puVar25 + -1);
            } while ((pBVar36 < pBVar33) &&
                    (pBVar33 = pBVar33 + -1, bVar15 = src < puVar25, puVar25 = puVar27, bVar15));
            goto LAB_005d18c4;
          }
        }
        goto LAB_005d18d4;
      }
      puVar25 = (ulong *)((long)puVar25 + ((long)puVar25 - (long)src >> 8) + 1);
      goto LAB_005d1746;
    }
  }
  else if (uVar22 == 6) {
    if (puVar25 < puVar10) {
      bVar19 = 0x40 - (char)(ms->cParams).hashLog;
      bVar20 = 0x40 - (char)(ms->cParams).chainLog;
      puVar1 = (ulong *)((long)puVar5 - 7);
      puVar2 = (ulong *)((long)puVar5 - 3);
      puVar3 = (ulong *)((long)puVar5 - 1);
      puVar4 = puVar5 + -4;
LAB_005d058e:
      uVar26 = *puVar25;
      uVar18 = uVar26 * -0x30e44323485a9b9d >> (bVar19 & 0x3f);
      uVar23 = uVar26 * -0x30e4432340650000 >> (bVar20 & 0x3f);
      UVar40 = (int)puVar25 - iVar30;
      uVar41 = pUVar13[uVar18];
      uVar34 = (ulong)uVar41;
      uVar44 = pUVar14[uVar23];
      uVar42 = (ulong)uVar44;
      pUVar14[uVar23] = UVar40;
      pUVar13[uVar18] = UVar40;
      puVar27 = (ulong *)((long)puVar25 + 1);
      uVar22 = (uint)uVar45;
      if ((uVar22 != 0) && (*(int *)((long)puVar27 - uVar45) == *(int *)((long)puVar25 + 1))) {
        lVar24 = -uVar45;
        puVar32 = (ulong *)((long)puVar25 + 5);
        puVar31 = (ulong *)((long)puVar25 + lVar24 + 5);
        puVar38 = puVar32;
        if (puVar32 < puVar1) {
          if (*puVar31 == *puVar32) {
            lVar37 = 0;
            do {
              puVar38 = (ulong *)((long)puVar25 + lVar37 + 0xd);
              if (puVar1 <= puVar38) {
                puVar31 = (ulong *)((long)puVar25 + lVar24 + lVar37 + 0xd);
                puVar38 = (ulong *)((long)puVar25 + lVar37 + 0xd);
                goto LAB_005d0882;
              }
              uVar26 = *(ulong *)((long)puVar25 + lVar37 + lVar24 + 0xd);
              uVar18 = *puVar38;
              lVar37 = lVar37 + 8;
            } while (uVar26 == uVar18);
            uVar18 = uVar18 ^ uVar26;
            uVar26 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
              }
            }
            uVar26 = (uVar26 >> 3 & 0x1fffffff) + lVar37;
          }
          else {
            uVar18 = *puVar32 ^ *puVar31;
            uVar26 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
              }
            }
            uVar26 = uVar26 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_005d0882:
          if ((puVar38 < puVar2) && ((int)*puVar31 == (int)*puVar38)) {
            puVar38 = (ulong *)((long)puVar38 + 4);
            puVar31 = (ulong *)((long)puVar31 + 4);
          }
          if ((puVar38 < puVar3) && ((short)*puVar31 == (short)*puVar38)) {
            puVar38 = (ulong *)((long)puVar38 + 2);
            puVar31 = (ulong *)((long)puVar31 + 2);
          }
          if (puVar38 < puVar5) {
            puVar38 = (ulong *)((long)puVar38 + (ulong)((char)*puVar31 == (char)*puVar38));
          }
          uVar26 = (long)puVar38 - (long)puVar32;
        }
        uVar18 = (long)puVar27 - (long)src;
        puVar25 = (ulong *)seqStore->lit;
        if (puVar4 < puVar27) {
          puVar32 = puVar25;
          puVar38 = (ulong *)src;
          if (src <= puVar4) {
            puVar32 = (ulong *)((long)puVar25 + ((long)puVar4 - (long)src));
            uVar23 = *(ulong *)((long)src + 8);
            *puVar25 = *src;
            puVar25[1] = uVar23;
            puVar38 = puVar4;
            if (0x10 < (long)puVar4 - (long)src) {
              lVar24 = 0x10;
              do {
                uVar16 = ((undefined8 *)((long)src + lVar24))[1];
                puVar7 = (undefined8 *)((long)puVar25 + lVar24);
                *puVar7 = *(undefined8 *)((long)src + lVar24);
                puVar7[1] = uVar16;
                puVar8 = (undefined8 *)((long)src + lVar24 + 0x10);
                uVar16 = puVar8[1];
                puVar7[2] = *puVar8;
                puVar7[3] = uVar16;
                lVar24 = lVar24 + 0x20;
              } while (puVar7 + 4 < puVar32);
            }
          }
          if (puVar38 < puVar27) {
            lVar24 = 0;
            do {
              *(undefined1 *)((long)puVar32 + lVar24) = *(undefined1 *)((long)puVar38 + lVar24);
              lVar24 = lVar24 + 1;
            } while ((long)puVar27 - (long)puVar38 != lVar24);
          }
LAB_005d09a2:
          seqStore->lit = seqStore->lit + uVar18;
          psVar43 = seqStore->sequences;
          if (0xffff < uVar18) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar43 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar23 = *(ulong *)((long)src + 8);
          *puVar25 = *src;
          puVar25[1] = uVar23;
          pBVar33 = seqStore->lit;
          if (0x10 < uVar18) {
            uVar23 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar33 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar33 + 0x18) = uVar23;
            if (0x20 < (long)uVar18) {
              lVar24 = 0;
              do {
                puVar7 = (undefined8 *)((long)src + lVar24 + 0x20);
                uVar16 = puVar7[1];
                pBVar9 = pBVar33 + lVar24 + 0x20;
                *(undefined8 *)pBVar9 = *puVar7;
                *(undefined8 *)(pBVar9 + 8) = uVar16;
                puVar7 = (undefined8 *)((long)src + lVar24 + 0x30);
                uVar16 = puVar7[1];
                *(undefined8 *)(pBVar9 + 0x10) = *puVar7;
                *(undefined8 *)(pBVar9 + 0x18) = uVar16;
                lVar24 = lVar24 + 0x20;
              } while (pBVar9 + 0x20 < pBVar33 + uVar18);
            }
            goto LAB_005d09a2;
          }
          seqStore->lit = pBVar33 + uVar18;
          psVar43 = seqStore->sequences;
        }
        lVar24 = uVar26 + 4;
        uVar26 = uVar26 + 1;
        psVar43->litLength = (U16)uVar18;
        psVar43->offset = 1;
        goto joined_r0x005d09f2;
      }
      if ((uVar17 < uVar41) && (puVar32 = (ulong *)(pBVar12 + uVar34), *puVar32 == uVar26)) {
        puVar27 = puVar25 + 1;
        puVar38 = puVar32 + 1;
        puVar31 = puVar27;
        if (puVar27 < puVar1) {
          if (*puVar38 == *puVar27) {
            lVar24 = 0;
            do {
              puVar38 = (ulong *)((long)puVar25 + lVar24 + 0x10);
              if (puVar1 <= puVar38) {
                puVar38 = (ulong *)(pBVar12 + lVar24 + uVar34 + 0x10);
                puVar31 = (ulong *)((long)puVar25 + lVar24 + 0x10);
                goto LAB_005d0cb9;
              }
              lVar37 = lVar24 + uVar34 + 0x10;
              uVar29 = *puVar38;
              lVar24 = lVar24 + 8;
            } while (*(ulong *)(pBVar12 + lVar37) == uVar29);
            uVar29 = uVar29 ^ *(ulong *)(pBVar12 + lVar37);
            uVar26 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
              }
            }
            uVar29 = (uVar26 >> 3 & 0x1fffffff) + lVar24;
          }
          else {
            uVar26 = *puVar27 ^ *puVar38;
            uVar29 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
              }
            }
            uVar29 = uVar29 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_005d0cb9:
          if ((puVar31 < puVar2) && ((int)*puVar38 == (int)*puVar31)) {
            puVar31 = (ulong *)((long)puVar31 + 4);
            puVar38 = (ulong *)((long)puVar38 + 4);
          }
          if ((puVar31 < puVar3) && ((short)*puVar38 == (short)*puVar31)) {
            puVar31 = (ulong *)((long)puVar31 + 2);
            puVar38 = (ulong *)((long)puVar38 + 2);
          }
          if (puVar31 < puVar5) {
            puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar38 == (char)*puVar31));
          }
          uVar29 = (long)puVar31 - (long)puVar27;
        }
        lVar24 = uVar29 + 8;
        uVar18 = (long)puVar25 - (long)puVar32;
        puVar27 = puVar25;
        if (src < puVar25) {
          pBVar33 = pBVar12 + (uVar34 - 1);
          puVar25 = (ulong *)((long)puVar25 + -1);
          do {
            if ((BYTE)*puVar25 != *pBVar33) goto LAB_005d0eb1;
            lVar24 = lVar24 + 1;
            puVar27 = (ulong *)((long)puVar25 + -1);
          } while ((pBVar36 < pBVar33) &&
                  (pBVar33 = pBVar33 + -1, bVar15 = src < puVar25, puVar25 = puVar27, bVar15));
LAB_005d0d44:
          puVar27 = (ulong *)((long)puVar27 + 1);
        }
        goto LAB_005d0eb7;
      }
      if ((uVar17 < uVar44) && (piVar6 = (int *)(pBVar12 + uVar42), *piVar6 == (int)*puVar25)) {
        uVar29 = *puVar27;
        uVar26 = uVar29 * -0x30e44323485a9b9d >> (bVar19 & 0x3f);
        uVar41 = pUVar13[uVar26];
        uVar23 = (ulong)uVar41;
        pUVar13[uVar26] = UVar40 + 1;
        if ((uVar17 < uVar41) && (puVar32 = (ulong *)(pBVar12 + uVar23), *puVar32 == uVar29)) {
          puVar38 = (ulong *)((long)puVar25 + 9);
          puVar31 = puVar32 + 1;
          puVar21 = puVar38;
          if (puVar38 < puVar1) {
            if (*puVar31 == *puVar38) {
              lVar24 = 0;
              do {
                puVar31 = (ulong *)((long)puVar25 + lVar24 + 0x11);
                if (puVar1 <= puVar31) {
                  puVar31 = (ulong *)(pBVar12 + lVar24 + uVar23 + 0x10);
                  puVar21 = (ulong *)((long)puVar25 + lVar24 + 0x11);
                  goto LAB_005d0e24;
                }
                lVar37 = lVar24 + uVar23 + 0x10;
                uVar29 = *puVar31;
                lVar24 = lVar24 + 8;
              } while (*(ulong *)(pBVar12 + lVar37) == uVar29);
              uVar29 = uVar29 ^ *(ulong *)(pBVar12 + lVar37);
              uVar26 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                }
              }
              uVar29 = (uVar26 >> 3 & 0x1fffffff) + lVar24;
            }
            else {
              uVar26 = *puVar38 ^ *puVar31;
              uVar29 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                }
              }
              uVar29 = uVar29 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_005d0e24:
            if ((puVar21 < puVar2) && ((int)*puVar31 == (int)*puVar21)) {
              puVar21 = (ulong *)((long)puVar21 + 4);
              puVar31 = (ulong *)((long)puVar31 + 4);
            }
            if ((puVar21 < puVar3) && ((short)*puVar31 == (short)*puVar21)) {
              puVar21 = (ulong *)((long)puVar21 + 2);
              puVar31 = (ulong *)((long)puVar31 + 2);
            }
            if (puVar21 < puVar5) {
              puVar21 = (ulong *)((long)puVar21 + (ulong)((char)*puVar31 == (char)*puVar21));
            }
            uVar29 = (long)puVar21 - (long)puVar38;
          }
          lVar24 = uVar29 + 8;
          uVar18 = (long)puVar27 - (long)puVar32;
          if (src < puVar27) {
            pBVar33 = pBVar12 + (uVar23 - 1);
            do {
              if ((BYTE)*puVar25 != *pBVar33) goto LAB_005d0eb1;
              lVar24 = lVar24 + 1;
              puVar27 = (ulong *)((long)puVar25 + -1);
            } while ((pBVar36 < pBVar33) &&
                    (pBVar33 = pBVar33 + -1, bVar15 = src < puVar25, puVar25 = puVar27, bVar15));
            goto LAB_005d0d44;
          }
        }
        else {
          puVar27 = (ulong *)((long)puVar25 + 4);
          puVar32 = (ulong *)(piVar6 + 1);
          puVar38 = puVar27;
          if (puVar27 < puVar1) {
            if (*puVar32 == *puVar27) {
              lVar24 = 0;
              do {
                puVar32 = (ulong *)((long)puVar25 + lVar24 + 0xc);
                if (puVar1 <= puVar32) {
                  puVar32 = (ulong *)(pBVar12 + lVar24 + uVar42 + 0xc);
                  puVar38 = (ulong *)((long)puVar25 + lVar24 + 0xc);
                  goto LAB_005d0d69;
                }
                lVar37 = lVar24 + uVar42 + 0xc;
                uVar29 = *puVar32;
                lVar24 = lVar24 + 8;
              } while (*(ulong *)(pBVar12 + lVar37) == uVar29);
              uVar29 = uVar29 ^ *(ulong *)(pBVar12 + lVar37);
              uVar26 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                }
              }
              uVar29 = (uVar26 >> 3 & 0x1fffffff) + lVar24;
            }
            else {
              uVar26 = *puVar27 ^ *puVar32;
              uVar29 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                }
              }
              uVar29 = uVar29 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_005d0d69:
            if ((puVar38 < puVar2) && ((int)*puVar32 == (int)*puVar38)) {
              puVar38 = (ulong *)((long)puVar38 + 4);
              puVar32 = (ulong *)((long)puVar32 + 4);
            }
            if ((puVar38 < puVar3) && ((short)*puVar32 == (short)*puVar38)) {
              puVar38 = (ulong *)((long)puVar38 + 2);
              puVar32 = (ulong *)((long)puVar32 + 2);
            }
            if (puVar38 < puVar5) {
              puVar38 = (ulong *)((long)puVar38 + (ulong)((char)*puVar32 == (char)*puVar38));
            }
            uVar29 = (long)puVar38 - (long)puVar27;
          }
          lVar24 = uVar29 + 4;
          uVar18 = (long)puVar25 - (long)piVar6;
          puVar27 = puVar25;
          if (src < puVar25) {
            pBVar33 = pBVar12 + (uVar42 - 1);
            do {
              puVar32 = (ulong *)((long)puVar25 + -1);
              puVar27 = puVar25;
              if ((*(BYTE *)puVar32 != *pBVar33) ||
                 (lVar24 = lVar24 + 1, puVar27 = puVar32, pBVar33 <= pBVar36)) break;
              pBVar33 = pBVar33 + -1;
              puVar25 = puVar32;
            } while (src < puVar32);
          }
        }
        goto LAB_005d0eb7;
      }
      puVar25 = (ulong *)((long)puVar25 + ((long)puVar25 - (long)src >> 8) + 1);
      goto LAB_005d0c53;
    }
  }
  else if (uVar22 == 7) {
    if (puVar25 < puVar10) {
      bVar19 = 0x40 - (char)(ms->cParams).hashLog;
      bVar20 = 0x40 - (char)(ms->cParams).chainLog;
      puVar1 = (ulong *)((long)puVar5 - 7);
      puVar2 = (ulong *)((long)puVar5 - 3);
      puVar3 = (ulong *)((long)puVar5 - 1);
      puVar4 = puVar5 + -4;
LAB_005cfab5:
      uVar26 = *puVar25;
      uVar18 = uVar26 * -0x30e44323485a9b9d >> (bVar19 & 0x3f);
      uVar23 = uVar26 * -0x30e44323405a9d00 >> (bVar20 & 0x3f);
      UVar40 = (int)puVar25 - iVar30;
      uVar41 = pUVar13[uVar18];
      uVar34 = (ulong)uVar41;
      uVar44 = pUVar14[uVar23];
      uVar42 = (ulong)uVar44;
      pUVar14[uVar23] = UVar40;
      pUVar13[uVar18] = UVar40;
      puVar27 = (ulong *)((long)puVar25 + 1);
      uVar22 = (uint)uVar45;
      if ((uVar22 != 0) && (*(int *)((long)puVar27 - uVar45) == *(int *)((long)puVar25 + 1))) {
        lVar24 = -uVar45;
        puVar32 = (ulong *)((long)puVar25 + 5);
        puVar31 = (ulong *)((long)puVar25 + lVar24 + 5);
        puVar38 = puVar32;
        if (puVar32 < puVar1) {
          if (*puVar31 == *puVar32) {
            lVar37 = 0;
            do {
              puVar38 = (ulong *)((long)puVar25 + lVar37 + 0xd);
              if (puVar1 <= puVar38) {
                puVar31 = (ulong *)((long)puVar25 + lVar24 + lVar37 + 0xd);
                puVar38 = (ulong *)((long)puVar25 + lVar37 + 0xd);
                goto LAB_005cfd97;
              }
              uVar26 = *(ulong *)((long)puVar25 + lVar37 + lVar24 + 0xd);
              uVar18 = *puVar38;
              lVar37 = lVar37 + 8;
            } while (uVar26 == uVar18);
            uVar18 = uVar18 ^ uVar26;
            uVar26 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
              }
            }
            uVar26 = (uVar26 >> 3 & 0x1fffffff) + lVar37;
          }
          else {
            uVar18 = *puVar32 ^ *puVar31;
            uVar26 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
              }
            }
            uVar26 = uVar26 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_005cfd97:
          if ((puVar38 < puVar2) && ((int)*puVar31 == (int)*puVar38)) {
            puVar38 = (ulong *)((long)puVar38 + 4);
            puVar31 = (ulong *)((long)puVar31 + 4);
          }
          if ((puVar38 < puVar3) && ((short)*puVar31 == (short)*puVar38)) {
            puVar38 = (ulong *)((long)puVar38 + 2);
            puVar31 = (ulong *)((long)puVar31 + 2);
          }
          if (puVar38 < puVar5) {
            puVar38 = (ulong *)((long)puVar38 + (ulong)((char)*puVar31 == (char)*puVar38));
          }
          uVar26 = (long)puVar38 - (long)puVar32;
        }
        uVar18 = (long)puVar27 - (long)src;
        puVar25 = (ulong *)seqStore->lit;
        if (puVar4 < puVar27) {
          puVar32 = puVar25;
          puVar38 = (ulong *)src;
          if (src <= puVar4) {
            puVar32 = (ulong *)((long)puVar25 + ((long)puVar4 - (long)src));
            uVar23 = *(ulong *)((long)src + 8);
            *puVar25 = *src;
            puVar25[1] = uVar23;
            puVar38 = puVar4;
            if (0x10 < (long)puVar4 - (long)src) {
              lVar24 = 0x10;
              do {
                uVar16 = ((undefined8 *)((long)src + lVar24))[1];
                puVar7 = (undefined8 *)((long)puVar25 + lVar24);
                *puVar7 = *(undefined8 *)((long)src + lVar24);
                puVar7[1] = uVar16;
                puVar8 = (undefined8 *)((long)src + lVar24 + 0x10);
                uVar16 = puVar8[1];
                puVar7[2] = *puVar8;
                puVar7[3] = uVar16;
                lVar24 = lVar24 + 0x20;
              } while (puVar7 + 4 < puVar32);
            }
          }
          if (puVar38 < puVar27) {
            lVar24 = 0;
            do {
              *(undefined1 *)((long)puVar32 + lVar24) = *(undefined1 *)((long)puVar38 + lVar24);
              lVar24 = lVar24 + 1;
            } while ((long)puVar27 - (long)puVar38 != lVar24);
          }
LAB_005cfeb7:
          seqStore->lit = seqStore->lit + uVar18;
          psVar43 = seqStore->sequences;
          if (0xffff < uVar18) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar43 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar23 = *(ulong *)((long)src + 8);
          *puVar25 = *src;
          puVar25[1] = uVar23;
          pBVar33 = seqStore->lit;
          if (0x10 < uVar18) {
            uVar23 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar33 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar33 + 0x18) = uVar23;
            if (0x20 < (long)uVar18) {
              lVar24 = 0;
              do {
                puVar7 = (undefined8 *)((long)src + lVar24 + 0x20);
                uVar16 = puVar7[1];
                pBVar9 = pBVar33 + lVar24 + 0x20;
                *(undefined8 *)pBVar9 = *puVar7;
                *(undefined8 *)(pBVar9 + 8) = uVar16;
                puVar7 = (undefined8 *)((long)src + lVar24 + 0x30);
                uVar16 = puVar7[1];
                *(undefined8 *)(pBVar9 + 0x10) = *puVar7;
                *(undefined8 *)(pBVar9 + 0x18) = uVar16;
                lVar24 = lVar24 + 0x20;
              } while (pBVar9 + 0x20 < pBVar33 + uVar18);
            }
            goto LAB_005cfeb7;
          }
          seqStore->lit = pBVar33 + uVar18;
          psVar43 = seqStore->sequences;
        }
        lVar24 = uVar26 + 4;
        uVar26 = uVar26 + 1;
        psVar43->litLength = (U16)uVar18;
        psVar43->offset = 1;
        goto joined_r0x005cff07;
      }
      if ((uVar17 < uVar41) && (puVar32 = (ulong *)(pBVar12 + uVar34), *puVar32 == uVar26)) {
        puVar27 = puVar25 + 1;
        puVar38 = puVar32 + 1;
        puVar31 = puVar27;
        if (puVar27 < puVar1) {
          if (*puVar38 == *puVar27) {
            lVar24 = 0;
            do {
              puVar38 = (ulong *)((long)puVar25 + lVar24 + 0x10);
              if (puVar1 <= puVar38) {
                puVar38 = (ulong *)(pBVar12 + lVar24 + uVar34 + 0x10);
                puVar31 = (ulong *)((long)puVar25 + lVar24 + 0x10);
                goto LAB_005d01c1;
              }
              lVar37 = lVar24 + uVar34 + 0x10;
              uVar29 = *puVar38;
              lVar24 = lVar24 + 8;
            } while (*(ulong *)(pBVar12 + lVar37) == uVar29);
            uVar29 = uVar29 ^ *(ulong *)(pBVar12 + lVar37);
            uVar26 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
              }
            }
            uVar29 = (uVar26 >> 3 & 0x1fffffff) + lVar24;
          }
          else {
            uVar26 = *puVar27 ^ *puVar38;
            uVar29 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
              }
            }
            uVar29 = uVar29 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_005d01c1:
          if ((puVar31 < puVar2) && ((int)*puVar38 == (int)*puVar31)) {
            puVar31 = (ulong *)((long)puVar31 + 4);
            puVar38 = (ulong *)((long)puVar38 + 4);
          }
          if ((puVar31 < puVar3) && ((short)*puVar38 == (short)*puVar31)) {
            puVar31 = (ulong *)((long)puVar31 + 2);
            puVar38 = (ulong *)((long)puVar38 + 2);
          }
          if (puVar31 < puVar5) {
            puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar38 == (char)*puVar31));
          }
          uVar29 = (long)puVar31 - (long)puVar27;
        }
        lVar24 = uVar29 + 8;
        uVar18 = (long)puVar25 - (long)puVar32;
        puVar27 = puVar25;
        if (src < puVar25) {
          pBVar33 = pBVar12 + (uVar34 - 1);
          puVar25 = (ulong *)((long)puVar25 + -1);
          do {
            if ((BYTE)*puVar25 != *pBVar33) goto LAB_005d02ef;
            lVar24 = lVar24 + 1;
            puVar27 = (ulong *)((long)puVar25 + -1);
          } while ((pBVar36 < pBVar33) &&
                  (pBVar33 = pBVar33 + -1, bVar15 = src < puVar25, puVar25 = puVar27, bVar15));
LAB_005d02ea:
          puVar27 = (ulong *)((long)puVar27 + 1);
        }
        goto LAB_005d02fa;
      }
      if ((uVar17 < uVar44) && (piVar6 = (int *)(pBVar12 + uVar42), *piVar6 == (int)*puVar25)) {
        uVar29 = *puVar27;
        uVar26 = uVar29 * -0x30e44323485a9b9d >> (bVar19 & 0x3f);
        uVar41 = pUVar13[uVar26];
        uVar23 = (ulong)uVar41;
        pUVar13[uVar26] = UVar40 + 1;
        if ((uVar17 < uVar41) && (puVar32 = (ulong *)(pBVar12 + uVar23), *puVar32 == uVar29)) {
          puVar38 = (ulong *)((long)puVar25 + 9);
          puVar31 = puVar32 + 1;
          puVar21 = puVar38;
          if (puVar38 < puVar1) {
            if (*puVar31 == *puVar38) {
              lVar24 = 0;
              do {
                puVar31 = (ulong *)((long)puVar25 + lVar24 + 0x11);
                if (puVar1 <= puVar31) {
                  puVar31 = (ulong *)(pBVar12 + lVar24 + uVar23 + 0x10);
                  puVar21 = (ulong *)((long)puVar25 + lVar24 + 0x11);
                  goto LAB_005d045e;
                }
                lVar37 = lVar24 + uVar23 + 0x10;
                uVar29 = *puVar31;
                lVar24 = lVar24 + 8;
              } while (*(ulong *)(pBVar12 + lVar37) == uVar29);
              uVar29 = uVar29 ^ *(ulong *)(pBVar12 + lVar37);
              uVar26 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                }
              }
              uVar29 = (uVar26 >> 3 & 0x1fffffff) + lVar24;
            }
            else {
              uVar26 = *puVar38 ^ *puVar31;
              uVar29 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                }
              }
              uVar29 = uVar29 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_005d045e:
            if ((puVar21 < puVar2) && ((int)*puVar31 == (int)*puVar21)) {
              puVar21 = (ulong *)((long)puVar21 + 4);
              puVar31 = (ulong *)((long)puVar31 + 4);
            }
            if ((puVar21 < puVar3) && ((short)*puVar31 == (short)*puVar21)) {
              puVar21 = (ulong *)((long)puVar21 + 2);
              puVar31 = (ulong *)((long)puVar31 + 2);
            }
            if (puVar21 < puVar5) {
              puVar21 = (ulong *)((long)puVar21 + (ulong)((char)*puVar31 == (char)*puVar21));
            }
            uVar29 = (long)puVar21 - (long)puVar38;
          }
          lVar24 = uVar29 + 8;
          uVar18 = (long)puVar27 - (long)puVar32;
          if (src < puVar27) {
            pBVar33 = pBVar12 + (uVar23 - 1);
            while (puVar27 = puVar25, (BYTE)*puVar27 == *pBVar33) {
              lVar24 = lVar24 + 1;
              if ((pBVar33 <= pBVar36) ||
                 (pBVar33 = pBVar33 + -1, puVar25 = (ulong *)((long)puVar27 + -1), puVar27 <= src))
              goto LAB_005d02fa;
            }
            puVar27 = (ulong *)((long)puVar27 + 1);
          }
        }
        else {
          puVar27 = (ulong *)((long)puVar25 + 4);
          puVar32 = (ulong *)(piVar6 + 1);
          puVar38 = puVar27;
          if (puVar27 < puVar1) {
            if (*puVar32 == *puVar27) {
              lVar24 = 0;
              do {
                puVar32 = (ulong *)((long)puVar25 + lVar24 + 0xc);
                if (puVar1 <= puVar32) {
                  puVar32 = (ulong *)(pBVar12 + lVar24 + uVar42 + 0xc);
                  puVar38 = (ulong *)((long)puVar25 + lVar24 + 0xc);
                  goto LAB_005d026a;
                }
                lVar37 = lVar24 + uVar42 + 0xc;
                uVar29 = *puVar32;
                lVar24 = lVar24 + 8;
              } while (*(ulong *)(pBVar12 + lVar37) == uVar29);
              uVar29 = uVar29 ^ *(ulong *)(pBVar12 + lVar37);
              uVar26 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                }
              }
              uVar29 = (uVar26 >> 3 & 0x1fffffff) + lVar24;
            }
            else {
              uVar26 = *puVar27 ^ *puVar32;
              uVar29 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                }
              }
              uVar29 = uVar29 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_005d026a:
            if ((puVar38 < puVar2) && ((int)*puVar32 == (int)*puVar38)) {
              puVar38 = (ulong *)((long)puVar38 + 4);
              puVar32 = (ulong *)((long)puVar32 + 4);
            }
            if ((puVar38 < puVar3) && ((short)*puVar32 == (short)*puVar38)) {
              puVar38 = (ulong *)((long)puVar38 + 2);
              puVar32 = (ulong *)((long)puVar32 + 2);
            }
            if (puVar38 < puVar5) {
              puVar38 = (ulong *)((long)puVar38 + (ulong)((char)*puVar32 == (char)*puVar38));
            }
            uVar29 = (long)puVar38 - (long)puVar27;
          }
          lVar24 = uVar29 + 4;
          uVar18 = (long)puVar25 - (long)piVar6;
          puVar27 = puVar25;
          if (src < puVar25) {
            pBVar33 = pBVar12 + (uVar42 - 1);
            puVar25 = (ulong *)((long)puVar25 + -1);
            do {
              if ((BYTE)*puVar25 != *pBVar33) goto LAB_005d02ef;
              lVar24 = lVar24 + 1;
              puVar27 = (ulong *)((long)puVar25 + -1);
            } while ((pBVar36 < pBVar33) &&
                    (pBVar33 = pBVar33 + -1, bVar15 = src < puVar25, puVar25 = puVar27, bVar15));
            goto LAB_005d02ea;
          }
        }
        goto LAB_005d02fa;
      }
      puVar25 = (ulong *)((long)puVar25 + ((long)puVar25 - (long)src >> 8) + 1);
      goto LAB_005d016c;
    }
  }
  else if (puVar25 < puVar10) {
    bVar19 = 0x40 - (char)(ms->cParams).hashLog;
    bVar20 = 0x20 - (char)(ms->cParams).chainLog;
    puVar1 = (ulong *)((long)puVar5 - 7);
    puVar2 = (ulong *)((long)puVar5 - 3);
    puVar3 = (ulong *)((long)puVar5 - 1);
    puVar4 = puVar5 + -4;
LAB_005d1b4f:
    uVar26 = *puVar25 * -0x30e44323485a9b9d >> (bVar19 & 0x3f);
    uVar22 = (uint)((int)*puVar25 * -0x61c8864f) >> (bVar20 & 0x1f);
    UVar40 = (int)puVar25 - iVar30;
    uVar41 = pUVar13[uVar26];
    uVar18 = (ulong)uVar41;
    uVar44 = pUVar14[uVar22];
    uVar23 = (ulong)uVar44;
    pUVar14[uVar22] = UVar40;
    pUVar13[uVar26] = UVar40;
    puVar27 = (ulong *)((long)puVar25 + 1);
    uVar22 = (uint)uVar45;
    if ((uVar22 != 0) && (*(int *)((long)puVar27 - uVar45) == *(int *)((long)puVar25 + 1))) {
      lVar24 = -uVar45;
      puVar32 = (ulong *)((long)puVar25 + 5);
      puVar31 = (ulong *)((long)puVar25 + lVar24 + 5);
      puVar38 = puVar32;
      if (puVar32 < puVar1) {
        if (*puVar31 == *puVar32) {
          lVar37 = 0;
          do {
            puVar38 = (ulong *)((long)puVar25 + lVar37 + 0xd);
            if (puVar1 <= puVar38) {
              puVar31 = (ulong *)((long)puVar25 + lVar24 + lVar37 + 0xd);
              puVar38 = (ulong *)((long)puVar25 + lVar37 + 0xd);
              goto LAB_005d1e29;
            }
            uVar26 = *(ulong *)((long)puVar25 + lVar37 + lVar24 + 0xd);
            uVar18 = *puVar38;
            lVar37 = lVar37 + 8;
          } while (uVar26 == uVar18);
          uVar18 = uVar18 ^ uVar26;
          uVar26 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
            }
          }
          uVar26 = (uVar26 >> 3 & 0x1fffffff) + lVar37;
        }
        else {
          uVar18 = *puVar32 ^ *puVar31;
          uVar26 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
            }
          }
          uVar26 = uVar26 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_005d1e29:
        if ((puVar38 < puVar2) && ((int)*puVar31 == (int)*puVar38)) {
          puVar38 = (ulong *)((long)puVar38 + 4);
          puVar31 = (ulong *)((long)puVar31 + 4);
        }
        if ((puVar38 < puVar3) && ((short)*puVar31 == (short)*puVar38)) {
          puVar38 = (ulong *)((long)puVar38 + 2);
          puVar31 = (ulong *)((long)puVar31 + 2);
        }
        if (puVar38 < puVar5) {
          puVar38 = (ulong *)((long)puVar38 + (ulong)((char)*puVar31 == (char)*puVar38));
        }
        uVar26 = (long)puVar38 - (long)puVar32;
      }
      uVar18 = (long)puVar27 - (long)src;
      puVar25 = (ulong *)seqStore->lit;
      if (puVar4 < puVar27) {
        puVar32 = puVar25;
        puVar38 = (ulong *)src;
        if (src <= puVar4) {
          puVar32 = (ulong *)((long)puVar25 + ((long)puVar4 - (long)src));
          uVar23 = *(ulong *)((long)src + 8);
          *puVar25 = *src;
          puVar25[1] = uVar23;
          puVar38 = puVar4;
          if (0x10 < (long)puVar4 - (long)src) {
            lVar24 = 0x10;
            do {
              uVar16 = ((undefined8 *)((long)src + lVar24))[1];
              puVar7 = (undefined8 *)((long)puVar25 + lVar24);
              *puVar7 = *(undefined8 *)((long)src + lVar24);
              puVar7[1] = uVar16;
              puVar8 = (undefined8 *)((long)src + lVar24 + 0x10);
              uVar16 = puVar8[1];
              puVar7[2] = *puVar8;
              puVar7[3] = uVar16;
              lVar24 = lVar24 + 0x20;
            } while (puVar7 + 4 < puVar32);
          }
        }
        if (puVar38 < puVar27) {
          lVar24 = 0;
          do {
            *(undefined1 *)((long)puVar32 + lVar24) = *(undefined1 *)((long)puVar38 + lVar24);
            lVar24 = lVar24 + 1;
          } while ((long)puVar27 - (long)puVar38 != lVar24);
        }
LAB_005d1f49:
        seqStore->lit = seqStore->lit + uVar18;
        psVar43 = seqStore->sequences;
        if (0xffff < uVar18) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar43 - (long)seqStore->sequencesStart) >> 3);
        }
      }
      else {
        uVar23 = *(ulong *)((long)src + 8);
        *puVar25 = *src;
        puVar25[1] = uVar23;
        pBVar33 = seqStore->lit;
        if (0x10 < uVar18) {
          uVar23 = *(ulong *)((long)src + 0x18);
          *(ulong *)(pBVar33 + 0x10) = *(ulong *)((long)src + 0x10);
          *(ulong *)(pBVar33 + 0x18) = uVar23;
          if (0x20 < (long)uVar18) {
            lVar24 = 0;
            do {
              puVar7 = (undefined8 *)((long)src + lVar24 + 0x20);
              uVar16 = puVar7[1];
              pBVar9 = pBVar33 + lVar24 + 0x20;
              *(undefined8 *)pBVar9 = *puVar7;
              *(undefined8 *)(pBVar9 + 8) = uVar16;
              puVar7 = (undefined8 *)((long)src + lVar24 + 0x30);
              uVar16 = puVar7[1];
              *(undefined8 *)(pBVar9 + 0x10) = *puVar7;
              *(undefined8 *)(pBVar9 + 0x18) = uVar16;
              lVar24 = lVar24 + 0x20;
            } while (pBVar9 + 0x20 < pBVar33 + uVar18);
          }
          goto LAB_005d1f49;
        }
        seqStore->lit = pBVar33 + uVar18;
        psVar43 = seqStore->sequences;
      }
      lVar24 = uVar26 + 4;
      uVar26 = uVar26 + 1;
      psVar43->litLength = (U16)uVar18;
      psVar43->offset = 1;
      uVar34 = uVar45;
      goto joined_r0x005d1f99;
    }
    if ((uVar17 < uVar41) && (puVar32 = (ulong *)(pBVar12 + uVar18), *puVar32 == *puVar25)) {
      puVar27 = puVar25 + 1;
      puVar38 = puVar32 + 1;
      puVar31 = puVar27;
      if (puVar27 < puVar1) {
        if (*puVar38 == *puVar27) {
          lVar24 = 0;
          do {
            puVar38 = (ulong *)((long)puVar25 + lVar24 + 0x10);
            if (puVar1 <= puVar38) {
              puVar38 = (ulong *)(pBVar12 + lVar24 + uVar18 + 0x10);
              puVar31 = (ulong *)((long)puVar25 + lVar24 + 0x10);
              goto LAB_005d2236;
            }
            lVar37 = lVar24 + uVar18 + 0x10;
            uVar29 = *puVar38;
            lVar24 = lVar24 + 8;
          } while (*(ulong *)(pBVar12 + lVar37) == uVar29);
          uVar29 = uVar29 ^ *(ulong *)(pBVar12 + lVar37);
          uVar26 = 0;
          if (uVar29 != 0) {
            for (; (uVar29 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
            }
          }
          uVar29 = (uVar26 >> 3 & 0x1fffffff) + lVar24;
        }
        else {
          uVar26 = *puVar27 ^ *puVar38;
          uVar29 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
            }
          }
          uVar29 = uVar29 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_005d2236:
        if ((puVar31 < puVar2) && ((int)*puVar38 == (int)*puVar31)) {
          puVar31 = (ulong *)((long)puVar31 + 4);
          puVar38 = (ulong *)((long)puVar38 + 4);
        }
        if ((puVar31 < puVar3) && ((short)*puVar38 == (short)*puVar31)) {
          puVar31 = (ulong *)((long)puVar31 + 2);
          puVar38 = (ulong *)((long)puVar38 + 2);
        }
        if (puVar31 < puVar5) {
          puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar38 == (char)*puVar31));
        }
        uVar29 = (long)puVar31 - (long)puVar27;
      }
      lVar24 = uVar29 + 8;
      uVar34 = (long)puVar25 - (long)puVar32;
      puVar27 = puVar25;
      if (src < puVar25) {
        pBVar33 = pBVar12 + (uVar18 - 1);
        puVar25 = (ulong *)((long)puVar25 + -1);
        do {
          if ((BYTE)*puVar25 != *pBVar33) goto LAB_005d235f;
          lVar24 = lVar24 + 1;
          puVar27 = (ulong *)((long)puVar25 + -1);
        } while ((pBVar36 < pBVar33) &&
                (pBVar33 = pBVar33 + -1, bVar15 = src < puVar25, puVar25 = puVar27, bVar15));
LAB_005d235a:
        puVar27 = (ulong *)((long)puVar27 + 1);
      }
      goto LAB_005d236a;
    }
    if ((uVar17 < uVar44) && (piVar6 = (int *)(pBVar12 + uVar23), *piVar6 == (int)*puVar25)) {
      uVar29 = *puVar27;
      uVar26 = uVar29 * -0x30e44323485a9b9d >> (bVar19 & 0x3f);
      uVar41 = pUVar13[uVar26];
      uVar18 = (ulong)uVar41;
      pUVar13[uVar26] = UVar40 + 1;
      if ((uVar17 < uVar41) && (puVar32 = (ulong *)(pBVar12 + uVar18), *puVar32 == uVar29)) {
        puVar38 = (ulong *)((long)puVar25 + 9);
        puVar31 = puVar32 + 1;
        puVar21 = puVar38;
        if (puVar38 < puVar1) {
          if (*puVar31 == *puVar38) {
            lVar24 = 0;
            do {
              puVar31 = (ulong *)((long)puVar25 + lVar24 + 0x11);
              if (puVar1 <= puVar31) {
                puVar31 = (ulong *)(pBVar12 + lVar24 + uVar18 + 0x10);
                puVar21 = (ulong *)((long)puVar25 + lVar24 + 0x11);
                goto LAB_005d24ce;
              }
              lVar37 = lVar24 + uVar18 + 0x10;
              uVar29 = *puVar31;
              lVar24 = lVar24 + 8;
            } while (*(ulong *)(pBVar12 + lVar37) == uVar29);
            uVar29 = uVar29 ^ *(ulong *)(pBVar12 + lVar37);
            uVar26 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
              }
            }
            uVar29 = (uVar26 >> 3 & 0x1fffffff) + lVar24;
          }
          else {
            uVar26 = *puVar38 ^ *puVar31;
            uVar29 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
              }
            }
            uVar29 = uVar29 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_005d24ce:
          if ((puVar21 < puVar2) && ((int)*puVar31 == (int)*puVar21)) {
            puVar21 = (ulong *)((long)puVar21 + 4);
            puVar31 = (ulong *)((long)puVar31 + 4);
          }
          if ((puVar21 < puVar3) && ((short)*puVar31 == (short)*puVar21)) {
            puVar21 = (ulong *)((long)puVar21 + 2);
            puVar31 = (ulong *)((long)puVar31 + 2);
          }
          if (puVar21 < puVar5) {
            puVar21 = (ulong *)((long)puVar21 + (ulong)((char)*puVar31 == (char)*puVar21));
          }
          uVar29 = (long)puVar21 - (long)puVar38;
        }
        lVar24 = uVar29 + 8;
        uVar34 = (long)puVar27 - (long)puVar32;
        if (src < puVar27) {
          pBVar33 = pBVar12 + (uVar18 - 1);
          while (puVar27 = puVar25, (BYTE)*puVar27 == *pBVar33) {
            lVar24 = lVar24 + 1;
            if ((pBVar33 <= pBVar36) ||
               (pBVar33 = pBVar33 + -1, puVar25 = (ulong *)((long)puVar27 + -1), puVar27 <= src))
            goto LAB_005d236a;
          }
          puVar27 = (ulong *)((long)puVar27 + 1);
        }
      }
      else {
        puVar27 = (ulong *)((long)puVar25 + 4);
        puVar32 = (ulong *)(piVar6 + 1);
        puVar38 = puVar27;
        if (puVar27 < puVar1) {
          if (*puVar32 == *puVar27) {
            lVar24 = 0;
            do {
              puVar32 = (ulong *)((long)puVar25 + lVar24 + 0xc);
              if (puVar1 <= puVar32) {
                puVar32 = (ulong *)(pBVar12 + lVar24 + uVar23 + 0xc);
                puVar38 = (ulong *)((long)puVar25 + lVar24 + 0xc);
                goto LAB_005d22df;
              }
              lVar37 = lVar24 + uVar23 + 0xc;
              uVar29 = *puVar32;
              lVar24 = lVar24 + 8;
            } while (*(ulong *)(pBVar12 + lVar37) == uVar29);
            uVar29 = uVar29 ^ *(ulong *)(pBVar12 + lVar37);
            uVar26 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
              }
            }
            uVar29 = (uVar26 >> 3 & 0x1fffffff) + lVar24;
          }
          else {
            uVar26 = *puVar27 ^ *puVar32;
            uVar29 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
              }
            }
            uVar29 = uVar29 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_005d22df:
          if ((puVar38 < puVar2) && ((int)*puVar32 == (int)*puVar38)) {
            puVar38 = (ulong *)((long)puVar38 + 4);
            puVar32 = (ulong *)((long)puVar32 + 4);
          }
          if ((puVar38 < puVar3) && ((short)*puVar32 == (short)*puVar38)) {
            puVar38 = (ulong *)((long)puVar38 + 2);
            puVar32 = (ulong *)((long)puVar32 + 2);
          }
          if (puVar38 < puVar5) {
            puVar38 = (ulong *)((long)puVar38 + (ulong)((char)*puVar32 == (char)*puVar38));
          }
          uVar29 = (long)puVar38 - (long)puVar27;
        }
        lVar24 = uVar29 + 4;
        uVar34 = (long)puVar25 - (long)piVar6;
        puVar27 = puVar25;
        if (src < puVar25) {
          pBVar33 = pBVar12 + (uVar23 - 1);
          puVar25 = (ulong *)((long)puVar25 + -1);
          do {
            if ((BYTE)*puVar25 != *pBVar33) goto LAB_005d235f;
            lVar24 = lVar24 + 1;
            puVar27 = (ulong *)((long)puVar25 + -1);
          } while ((pBVar36 < pBVar33) &&
                  (pBVar33 = pBVar33 + -1, bVar15 = src < puVar25, puVar25 = puVar27, bVar15));
          goto LAB_005d235a;
        }
      }
      goto LAB_005d236a;
    }
    puVar25 = (ulong *)((long)puVar25 + ((long)puVar25 - (long)src >> 8) + 1);
    goto LAB_005d21e1;
  }
LAB_005d257c:
  uVar17 = 0;
  if (uVar39 < uVar28) {
    uVar17 = uVar28;
  }
  if (uVar39 < uVar11) {
    uVar17 = uVar11;
  }
  if (uVar44 == 0) {
    uVar44 = uVar17;
  }
  if (uVar41 != 0) {
    uVar17 = uVar41;
  }
  *rep = uVar44;
  rep[1] = uVar17;
  return (long)puVar5 - (long)src;
LAB_005d18c9:
  puVar27 = (ulong *)((long)puVar25 + 1);
LAB_005d18d4:
  uVar22 = (uint)uVar18;
  uVar29 = (long)puVar27 - (long)src;
  puVar25 = (ulong *)seqStore->lit;
  if (puVar4 < puVar27) {
    puVar32 = puVar25;
    puVar38 = (ulong *)src;
    if (src <= puVar4) {
      puVar32 = (ulong *)((long)puVar25 + ((long)puVar4 - (long)src));
      uVar26 = *(ulong *)((long)src + 8);
      *puVar25 = *src;
      puVar25[1] = uVar26;
      puVar38 = puVar4;
      if (0x10 < (long)puVar4 - (long)src) {
        lVar37 = 0x10;
        do {
          uVar16 = ((undefined8 *)((long)src + lVar37))[1];
          puVar7 = (undefined8 *)((long)puVar25 + lVar37);
          *puVar7 = *(undefined8 *)((long)src + lVar37);
          puVar7[1] = uVar16;
          puVar8 = (undefined8 *)((long)src + lVar37 + 0x10);
          uVar16 = puVar8[1];
          puVar7[2] = *puVar8;
          puVar7[3] = uVar16;
          lVar37 = lVar37 + 0x20;
        } while (puVar7 + 4 < puVar32);
      }
    }
    if (puVar38 < puVar27) {
      lVar37 = 0;
      do {
        *(undefined1 *)((long)puVar32 + lVar37) = *(undefined1 *)((long)puVar38 + lVar37);
        lVar37 = lVar37 + 1;
      } while ((long)puVar27 - (long)puVar38 != lVar37);
    }
  }
  else {
    uVar26 = *(ulong *)((long)src + 8);
    *puVar25 = *src;
    puVar25[1] = uVar26;
    pBVar33 = seqStore->lit;
    if (uVar29 < 0x11) {
      seqStore->lit = pBVar33 + uVar29;
      psVar43 = seqStore->sequences;
      goto LAB_005d19ee;
    }
    uVar26 = *(ulong *)((long)src + 0x18);
    *(ulong *)(pBVar33 + 0x10) = *(ulong *)((long)src + 0x10);
    *(ulong *)(pBVar33 + 0x18) = uVar26;
    if (0x20 < (long)uVar29) {
      lVar37 = 0;
      do {
        puVar7 = (undefined8 *)((long)src + lVar37 + 0x20);
        uVar16 = puVar7[1];
        pBVar9 = pBVar33 + lVar37 + 0x20;
        *(undefined8 *)pBVar9 = *puVar7;
        *(undefined8 *)(pBVar9 + 8) = uVar16;
        puVar7 = (undefined8 *)((long)src + lVar37 + 0x30);
        uVar16 = puVar7[1];
        *(undefined8 *)(pBVar9 + 0x10) = *puVar7;
        *(undefined8 *)(pBVar9 + 0x18) = uVar16;
        lVar37 = lVar37 + 0x20;
      } while (pBVar9 + 0x20 < pBVar33 + uVar29);
    }
  }
  seqStore->lit = seqStore->lit + uVar29;
  psVar43 = seqStore->sequences;
  if (0xffff < uVar29) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar43 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_005d19ee:
  uVar26 = lVar24 - 3;
  psVar43->litLength = (U16)uVar29;
  psVar43->offset = uVar22 + 3;
  uVar29 = uVar45;
  uVar45 = uVar18 & 0xffffffff;
joined_r0x005d14e1:
  if (0xffff < uVar26) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar43 - (long)seqStore->sequencesStart) >> 3);
    uVar45 = (ulong)uVar22;
  }
  puVar25 = (ulong *)(lVar24 + (long)puVar27);
  psVar43->matchLength = (U16)uVar26;
  psVar43 = psVar43 + 1;
  seqStore->sequences = psVar43;
  src = puVar25;
  if (puVar25 <= puVar10) {
    uVar41 = UVar40 + 2;
    lVar24 = *(long *)(pBVar12 + uVar41);
    pUVar13[(ulong)(lVar24 * -0x30e44323485a9b9d) >> (bVar19 & 0x3f)] = uVar41;
    pUVar13[(ulong)(*(long *)((long)puVar25 + -2) * -0x30e44323485a9b9d) >> (bVar19 & 0x3f)] =
         ((int)puVar25 + -2) - iVar30;
    pUVar14[(ulong)(lVar24 * -0x30e4432345000000) >> (bVar20 & 0x3f)] = uVar41;
    pUVar14[(ulong)(*(long *)((long)puVar25 + -1) * -0x30e4432345000000) >> (bVar20 & 0x3f)] =
         ((int)puVar25 + -1) - iVar30;
    do {
      uVar26 = uVar29;
      uVar29 = uVar26;
      src = puVar25;
      if (((int)uVar26 == 0) || ((int)*puVar25 != *(int *)((long)puVar25 - uVar26))) break;
      lVar24 = -uVar26;
      puVar27 = (ulong *)((long)puVar25 + 4);
      puVar38 = (ulong *)((long)puVar25 + lVar24 + 4);
      puVar32 = puVar27;
      if (puVar27 < puVar1) {
        if (*puVar38 == *puVar27) {
          lVar37 = 0;
          do {
            puVar32 = (ulong *)((long)puVar25 + lVar37 + 0xc);
            if (puVar1 <= puVar32) {
              puVar38 = (ulong *)((long)puVar25 + lVar24 + lVar37 + 0xc);
              puVar32 = (ulong *)((long)puVar25 + lVar37 + 0xc);
              goto LAB_005d1645;
            }
            uVar29 = *(ulong *)((long)puVar25 + lVar37 + lVar24 + 0xc);
            uVar18 = *puVar32;
            lVar37 = lVar37 + 8;
          } while (uVar29 == uVar18);
          uVar18 = uVar18 ^ uVar29;
          uVar29 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
            }
          }
          uVar29 = (uVar29 >> 3 & 0x1fffffff) + lVar37;
        }
        else {
          uVar18 = *puVar27 ^ *puVar38;
          uVar29 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
            }
          }
          uVar29 = uVar29 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_005d1645:
        if ((puVar32 < puVar2) && ((int)*puVar38 == (int)*puVar32)) {
          puVar32 = (ulong *)((long)puVar32 + 4);
          puVar38 = (ulong *)((long)puVar38 + 4);
        }
        if ((puVar32 < puVar3) && ((short)*puVar38 == (short)*puVar32)) {
          puVar32 = (ulong *)((long)puVar32 + 2);
          puVar38 = (ulong *)((long)puVar38 + 2);
        }
        if (puVar32 < puVar5) {
          puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar38 == (char)*puVar32));
        }
        uVar29 = (long)puVar32 - (long)puVar27;
      }
      uVar18 = *puVar25;
      UVar40 = (int)puVar25 - iVar30;
      pUVar14[uVar18 * -0x30e4432345000000 >> (bVar20 & 0x3f)] = UVar40;
      pUVar13[uVar18 * -0x30e44323485a9b9d >> (bVar19 & 0x3f)] = UVar40;
      if (puVar25 <= puVar4) {
        puVar27 = (ulong *)seqStore->lit;
        uVar18 = puVar25[1];
        *puVar27 = *puVar25;
        puVar27[1] = uVar18;
        psVar43 = seqStore->sequences;
      }
      psVar43->litLength = 0;
      psVar43->offset = 1;
      if (0xffff < uVar29 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar43 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar43->matchLength = (U16)(uVar29 + 1);
      psVar43 = psVar43 + 1;
      seqStore->sequences = psVar43;
      puVar25 = (ulong *)((long)puVar25 + uVar29 + 4);
      uVar29 = uVar45;
      uVar45 = uVar26;
      src = puVar25;
    } while (puVar25 <= puVar10);
  }
LAB_005d1746:
  uVar41 = (uint)uVar29;
  uVar44 = (uint)uVar45;
  if (puVar10 <= puVar25) goto LAB_005d257c;
  goto LAB_005d108f;
LAB_005d0eb1:
  puVar27 = (ulong *)((long)puVar25 + 1);
LAB_005d0eb7:
  uVar22 = (uint)uVar18;
  uVar29 = (long)puVar27 - (long)src;
  puVar25 = (ulong *)seqStore->lit;
  if (puVar4 < puVar27) {
    puVar32 = puVar25;
    puVar38 = (ulong *)src;
    if (src <= puVar4) {
      puVar32 = (ulong *)((long)puVar25 + ((long)puVar4 - (long)src));
      uVar26 = *(ulong *)((long)src + 8);
      *puVar25 = *src;
      puVar25[1] = uVar26;
      puVar38 = puVar4;
      if (0x10 < (long)puVar4 - (long)src) {
        lVar37 = 0x10;
        do {
          uVar16 = ((undefined8 *)((long)src + lVar37))[1];
          puVar7 = (undefined8 *)((long)puVar25 + lVar37);
          *puVar7 = *(undefined8 *)((long)src + lVar37);
          puVar7[1] = uVar16;
          puVar8 = (undefined8 *)((long)src + lVar37 + 0x10);
          uVar16 = puVar8[1];
          puVar7[2] = *puVar8;
          puVar7[3] = uVar16;
          lVar37 = lVar37 + 0x20;
        } while (puVar7 + 4 < puVar32);
      }
    }
    if (puVar38 < puVar27) {
      lVar37 = 0;
      do {
        *(undefined1 *)((long)puVar32 + lVar37) = *(undefined1 *)((long)puVar38 + lVar37);
        lVar37 = lVar37 + 1;
      } while ((long)puVar27 - (long)puVar38 != lVar37);
    }
  }
  else {
    uVar26 = *(ulong *)((long)src + 8);
    *puVar25 = *src;
    puVar25[1] = uVar26;
    pBVar33 = seqStore->lit;
    if (uVar29 < 0x11) {
      seqStore->lit = pBVar33 + uVar29;
      psVar43 = seqStore->sequences;
      goto LAB_005d0fd1;
    }
    uVar26 = *(ulong *)((long)src + 0x18);
    *(ulong *)(pBVar33 + 0x10) = *(ulong *)((long)src + 0x10);
    *(ulong *)(pBVar33 + 0x18) = uVar26;
    if (0x20 < (long)uVar29) {
      lVar37 = 0;
      do {
        puVar7 = (undefined8 *)((long)src + lVar37 + 0x20);
        uVar16 = puVar7[1];
        pBVar9 = pBVar33 + lVar37 + 0x20;
        *(undefined8 *)pBVar9 = *puVar7;
        *(undefined8 *)(pBVar9 + 8) = uVar16;
        puVar7 = (undefined8 *)((long)src + lVar37 + 0x30);
        uVar16 = puVar7[1];
        *(undefined8 *)(pBVar9 + 0x10) = *puVar7;
        *(undefined8 *)(pBVar9 + 0x18) = uVar16;
        lVar37 = lVar37 + 0x20;
      } while (pBVar9 + 0x20 < pBVar33 + uVar29);
    }
  }
  seqStore->lit = seqStore->lit + uVar29;
  psVar43 = seqStore->sequences;
  if (0xffff < uVar29) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar43 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_005d0fd1:
  uVar26 = lVar24 - 3;
  psVar43->litLength = (U16)uVar29;
  psVar43->offset = uVar22 + 3;
  uVar29 = uVar45;
  uVar45 = uVar18 & 0xffffffff;
joined_r0x005d09f2:
  if (0xffff < uVar26) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar43 - (long)seqStore->sequencesStart) >> 3);
    uVar45 = (ulong)uVar22;
  }
  puVar25 = (ulong *)(lVar24 + (long)puVar27);
  psVar43->matchLength = (U16)uVar26;
  psVar43 = psVar43 + 1;
  seqStore->sequences = psVar43;
  src = puVar25;
  if (puVar25 <= puVar10) {
    uVar41 = UVar40 + 2;
    lVar24 = *(long *)(pBVar12 + uVar41);
    pUVar13[(ulong)(lVar24 * -0x30e44323485a9b9d) >> (bVar19 & 0x3f)] = uVar41;
    pUVar13[(ulong)(*(long *)((long)puVar25 + -2) * -0x30e44323485a9b9d) >> (bVar19 & 0x3f)] =
         ((int)puVar25 + -2) - iVar30;
    pUVar14[(ulong)(lVar24 * -0x30e4432340650000) >> (bVar20 & 0x3f)] = uVar41;
    pUVar14[(ulong)(*(long *)((long)puVar25 + -1) * -0x30e4432340650000) >> (bVar20 & 0x3f)] =
         ((int)puVar25 + -1) - iVar30;
    do {
      uVar26 = uVar29;
      uVar29 = uVar26;
      src = puVar25;
      if (((int)uVar26 == 0) || ((int)*puVar25 != *(int *)((long)puVar25 - uVar26))) break;
      lVar24 = -uVar26;
      puVar27 = (ulong *)((long)puVar25 + 4);
      puVar38 = (ulong *)((long)puVar25 + lVar24 + 4);
      puVar32 = puVar27;
      if (puVar27 < puVar1) {
        if (*puVar38 == *puVar27) {
          lVar37 = 0;
          do {
            puVar32 = (ulong *)((long)puVar25 + lVar37 + 0xc);
            if (puVar1 <= puVar32) {
              puVar38 = (ulong *)((long)puVar25 + lVar24 + lVar37 + 0xc);
              puVar32 = (ulong *)((long)puVar25 + lVar37 + 0xc);
              goto LAB_005d0b52;
            }
            uVar29 = *(ulong *)((long)puVar25 + lVar37 + lVar24 + 0xc);
            uVar18 = *puVar32;
            lVar37 = lVar37 + 8;
          } while (uVar29 == uVar18);
          uVar18 = uVar18 ^ uVar29;
          uVar29 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
            }
          }
          uVar29 = (uVar29 >> 3 & 0x1fffffff) + lVar37;
        }
        else {
          uVar18 = *puVar27 ^ *puVar38;
          uVar29 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
            }
          }
          uVar29 = uVar29 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_005d0b52:
        if ((puVar32 < puVar2) && ((int)*puVar38 == (int)*puVar32)) {
          puVar32 = (ulong *)((long)puVar32 + 4);
          puVar38 = (ulong *)((long)puVar38 + 4);
        }
        if ((puVar32 < puVar3) && ((short)*puVar38 == (short)*puVar32)) {
          puVar32 = (ulong *)((long)puVar32 + 2);
          puVar38 = (ulong *)((long)puVar38 + 2);
        }
        if (puVar32 < puVar5) {
          puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar38 == (char)*puVar32));
        }
        uVar29 = (long)puVar32 - (long)puVar27;
      }
      uVar18 = *puVar25;
      UVar40 = (int)puVar25 - iVar30;
      pUVar14[uVar18 * -0x30e4432340650000 >> (bVar20 & 0x3f)] = UVar40;
      pUVar13[uVar18 * -0x30e44323485a9b9d >> (bVar19 & 0x3f)] = UVar40;
      if (puVar25 <= puVar4) {
        puVar27 = (ulong *)seqStore->lit;
        uVar18 = puVar25[1];
        *puVar27 = *puVar25;
        puVar27[1] = uVar18;
        psVar43 = seqStore->sequences;
      }
      psVar43->litLength = 0;
      psVar43->offset = 1;
      if (0xffff < uVar29 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar43 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar43->matchLength = (U16)(uVar29 + 1);
      psVar43 = psVar43 + 1;
      seqStore->sequences = psVar43;
      puVar25 = (ulong *)((long)puVar25 + uVar29 + 4);
      uVar29 = uVar45;
      uVar45 = uVar26;
      src = puVar25;
    } while (puVar25 <= puVar10);
  }
LAB_005d0c53:
  uVar41 = (uint)uVar29;
  uVar44 = (uint)uVar45;
  if (puVar10 <= puVar25) goto LAB_005d257c;
  goto LAB_005d058e;
LAB_005d235f:
  puVar27 = (ulong *)((long)puVar25 + 1);
LAB_005d236a:
  uVar22 = (uint)uVar34;
  uVar29 = (long)puVar27 - (long)src;
  puVar25 = (ulong *)seqStore->lit;
  if (puVar4 < puVar27) {
    puVar32 = puVar25;
    puVar38 = (ulong *)src;
    if (src <= puVar4) {
      puVar32 = (ulong *)((long)puVar25 + ((long)puVar4 - (long)src));
      uVar26 = *(ulong *)((long)src + 8);
      *puVar25 = *src;
      puVar25[1] = uVar26;
      puVar38 = puVar4;
      if (0x10 < (long)puVar4 - (long)src) {
        lVar37 = 0x10;
        do {
          uVar16 = ((undefined8 *)((long)src + lVar37))[1];
          puVar7 = (undefined8 *)((long)puVar25 + lVar37);
          *puVar7 = *(undefined8 *)((long)src + lVar37);
          puVar7[1] = uVar16;
          puVar8 = (undefined8 *)((long)src + lVar37 + 0x10);
          uVar16 = puVar8[1];
          puVar7[2] = *puVar8;
          puVar7[3] = uVar16;
          lVar37 = lVar37 + 0x20;
        } while (puVar7 + 4 < puVar32);
      }
    }
    if (puVar38 < puVar27) {
      lVar37 = 0;
      do {
        *(undefined1 *)((long)puVar32 + lVar37) = *(undefined1 *)((long)puVar38 + lVar37);
        lVar37 = lVar37 + 1;
      } while ((long)puVar27 - (long)puVar38 != lVar37);
    }
  }
  else {
    uVar26 = *(ulong *)((long)src + 8);
    *puVar25 = *src;
    puVar25[1] = uVar26;
    pBVar33 = seqStore->lit;
    if (uVar29 < 0x11) {
      seqStore->lit = pBVar33 + uVar29;
      psVar43 = seqStore->sequences;
      goto LAB_005d2484;
    }
    uVar26 = *(ulong *)((long)src + 0x18);
    *(ulong *)(pBVar33 + 0x10) = *(ulong *)((long)src + 0x10);
    *(ulong *)(pBVar33 + 0x18) = uVar26;
    if (0x20 < (long)uVar29) {
      lVar37 = 0;
      do {
        puVar7 = (undefined8 *)((long)src + lVar37 + 0x20);
        uVar16 = puVar7[1];
        pBVar9 = pBVar33 + lVar37 + 0x20;
        *(undefined8 *)pBVar9 = *puVar7;
        *(undefined8 *)(pBVar9 + 8) = uVar16;
        puVar7 = (undefined8 *)((long)src + lVar37 + 0x30);
        uVar16 = puVar7[1];
        *(undefined8 *)(pBVar9 + 0x10) = *puVar7;
        *(undefined8 *)(pBVar9 + 0x18) = uVar16;
        lVar37 = lVar37 + 0x20;
      } while (pBVar9 + 0x20 < pBVar33 + uVar29);
    }
  }
  seqStore->lit = seqStore->lit + uVar29;
  psVar43 = seqStore->sequences;
  if (0xffff < uVar29) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar43 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_005d2484:
  uVar26 = lVar24 - 3;
  psVar43->litLength = (U16)uVar29;
  psVar43->offset = uVar22 + 3;
  uVar34 = uVar34 & 0xffffffff;
  uVar29 = uVar45;
joined_r0x005d1f99:
  if (0xffff < uVar26) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar43 - (long)seqStore->sequencesStart) >> 3);
    uVar34 = (ulong)uVar22;
  }
  puVar25 = (ulong *)(lVar24 + (long)puVar27);
  psVar43->matchLength = (U16)uVar26;
  psVar43 = psVar43 + 1;
  seqStore->sequences = psVar43;
  src = puVar25;
  uVar45 = uVar34;
  if (puVar25 <= puVar10) {
    uVar41 = UVar40 + 2;
    pUVar13[(ulong)(*(long *)(pBVar12 + uVar41) * -0x30e44323485a9b9d) >> (bVar19 & 0x3f)] = uVar41;
    pUVar13[(ulong)(*(long *)((long)puVar25 + -2) * -0x30e44323485a9b9d) >> (bVar19 & 0x3f)] =
         ((int)puVar25 + -2) - iVar30;
    pUVar14[(uint)(*(int *)(pBVar12 + uVar41) * -0x61c8864f) >> (bVar20 & 0x1f)] = uVar41;
    pUVar14[(uint)(*(int *)((long)puVar25 + -1) * -0x61c8864f) >> (bVar20 & 0x1f)] =
         ((int)puVar25 + -1) - iVar30;
    do {
      uVar45 = uVar34;
      uVar34 = uVar29;
      uVar29 = uVar34;
      src = puVar25;
      if (((int)uVar34 == 0) || ((int)*puVar25 != *(int *)((long)puVar25 - uVar34))) break;
      lVar24 = -uVar34;
      puVar27 = (ulong *)((long)puVar25 + 4);
      puVar38 = (ulong *)((long)puVar25 + lVar24 + 4);
      puVar32 = puVar27;
      if (puVar27 < puVar1) {
        if (*puVar38 == *puVar27) {
          lVar37 = 0;
          do {
            puVar32 = (ulong *)((long)puVar25 + lVar37 + 0xc);
            if (puVar1 <= puVar32) {
              puVar38 = (ulong *)((long)puVar25 + lVar24 + lVar37 + 0xc);
              puVar32 = (ulong *)((long)puVar25 + lVar37 + 0xc);
              goto LAB_005d20e5;
            }
            uVar29 = *(ulong *)((long)puVar25 + lVar37 + lVar24 + 0xc);
            uVar26 = *puVar32;
            lVar37 = lVar37 + 8;
          } while (uVar29 == uVar26);
          uVar26 = uVar26 ^ uVar29;
          uVar29 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
            }
          }
          uVar29 = (uVar29 >> 3 & 0x1fffffff) + lVar37;
        }
        else {
          uVar26 = *puVar27 ^ *puVar38;
          uVar29 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
            }
          }
          uVar29 = uVar29 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_005d20e5:
        if ((puVar32 < puVar2) && ((int)*puVar38 == (int)*puVar32)) {
          puVar32 = (ulong *)((long)puVar32 + 4);
          puVar38 = (ulong *)((long)puVar38 + 4);
        }
        if ((puVar32 < puVar3) && ((short)*puVar38 == (short)*puVar32)) {
          puVar32 = (ulong *)((long)puVar32 + 2);
          puVar38 = (ulong *)((long)puVar38 + 2);
        }
        if (puVar32 < puVar5) {
          puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar38 == (char)*puVar32));
        }
        uVar29 = (long)puVar32 - (long)puVar27;
      }
      UVar40 = (int)puVar25 - iVar30;
      pUVar14[(uint)((int)*puVar25 * -0x61c8864f) >> (bVar20 & 0x1f)] = UVar40;
      pUVar13[*puVar25 * -0x30e44323485a9b9d >> (bVar19 & 0x3f)] = UVar40;
      if (puVar25 <= puVar4) {
        puVar27 = (ulong *)seqStore->lit;
        uVar26 = puVar25[1];
        *puVar27 = *puVar25;
        puVar27[1] = uVar26;
        psVar43 = seqStore->sequences;
      }
      psVar43->litLength = 0;
      psVar43->offset = 1;
      if (0xffff < uVar29 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar43 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar43->matchLength = (U16)(uVar29 + 1);
      psVar43 = psVar43 + 1;
      seqStore->sequences = psVar43;
      puVar25 = (ulong *)((long)puVar25 + uVar29 + 4);
      uVar29 = uVar45;
      src = puVar25;
      uVar45 = uVar34;
    } while (puVar25 <= puVar10);
  }
LAB_005d21e1:
  uVar41 = (uint)uVar29;
  uVar44 = (uint)uVar45;
  if (puVar10 <= puVar25) goto LAB_005d257c;
  goto LAB_005d1b4f;
LAB_005d02ef:
  puVar27 = (ulong *)((long)puVar25 + 1);
LAB_005d02fa:
  uVar22 = (uint)uVar18;
  uVar29 = (long)puVar27 - (long)src;
  puVar25 = (ulong *)seqStore->lit;
  if (puVar4 < puVar27) {
    puVar32 = puVar25;
    puVar38 = (ulong *)src;
    if (src <= puVar4) {
      puVar32 = (ulong *)((long)puVar25 + ((long)puVar4 - (long)src));
      uVar26 = *(ulong *)((long)src + 8);
      *puVar25 = *src;
      puVar25[1] = uVar26;
      puVar38 = puVar4;
      if (0x10 < (long)puVar4 - (long)src) {
        lVar37 = 0x10;
        do {
          uVar16 = ((undefined8 *)((long)src + lVar37))[1];
          puVar7 = (undefined8 *)((long)puVar25 + lVar37);
          *puVar7 = *(undefined8 *)((long)src + lVar37);
          puVar7[1] = uVar16;
          puVar8 = (undefined8 *)((long)src + lVar37 + 0x10);
          uVar16 = puVar8[1];
          puVar7[2] = *puVar8;
          puVar7[3] = uVar16;
          lVar37 = lVar37 + 0x20;
        } while (puVar7 + 4 < puVar32);
      }
    }
    if (puVar38 < puVar27) {
      lVar37 = 0;
      do {
        *(undefined1 *)((long)puVar32 + lVar37) = *(undefined1 *)((long)puVar38 + lVar37);
        lVar37 = lVar37 + 1;
      } while ((long)puVar27 - (long)puVar38 != lVar37);
    }
  }
  else {
    uVar26 = *(ulong *)((long)src + 8);
    *puVar25 = *src;
    puVar25[1] = uVar26;
    pBVar33 = seqStore->lit;
    if (uVar29 < 0x11) {
      seqStore->lit = pBVar33 + uVar29;
      psVar43 = seqStore->sequences;
      goto LAB_005d0414;
    }
    uVar26 = *(ulong *)((long)src + 0x18);
    *(ulong *)(pBVar33 + 0x10) = *(ulong *)((long)src + 0x10);
    *(ulong *)(pBVar33 + 0x18) = uVar26;
    if (0x20 < (long)uVar29) {
      lVar37 = 0;
      do {
        puVar7 = (undefined8 *)((long)src + lVar37 + 0x20);
        uVar16 = puVar7[1];
        pBVar9 = pBVar33 + lVar37 + 0x20;
        *(undefined8 *)pBVar9 = *puVar7;
        *(undefined8 *)(pBVar9 + 8) = uVar16;
        puVar7 = (undefined8 *)((long)src + lVar37 + 0x30);
        uVar16 = puVar7[1];
        *(undefined8 *)(pBVar9 + 0x10) = *puVar7;
        *(undefined8 *)(pBVar9 + 0x18) = uVar16;
        lVar37 = lVar37 + 0x20;
      } while (pBVar9 + 0x20 < pBVar33 + uVar29);
    }
  }
  seqStore->lit = seqStore->lit + uVar29;
  psVar43 = seqStore->sequences;
  if (0xffff < uVar29) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar43 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_005d0414:
  uVar26 = lVar24 - 3;
  psVar43->litLength = (U16)uVar29;
  psVar43->offset = uVar22 + 3;
  uVar29 = uVar45;
  uVar45 = uVar18 & 0xffffffff;
joined_r0x005cff07:
  if (0xffff < uVar26) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar43 - (long)seqStore->sequencesStart) >> 3);
    uVar45 = (ulong)uVar22;
  }
  puVar25 = (ulong *)(lVar24 + (long)puVar27);
  psVar43->matchLength = (U16)uVar26;
  psVar43 = psVar43 + 1;
  seqStore->sequences = psVar43;
  src = puVar25;
  if (puVar25 <= puVar10) {
    uVar41 = UVar40 + 2;
    lVar24 = *(long *)(pBVar12 + uVar41);
    pUVar13[(ulong)(lVar24 * -0x30e44323485a9b9d) >> (bVar19 & 0x3f)] = uVar41;
    pUVar13[(ulong)(*(long *)((long)puVar25 + -2) * -0x30e44323485a9b9d) >> (bVar19 & 0x3f)] =
         ((int)puVar25 + -2) - iVar30;
    pUVar14[(ulong)(lVar24 * -0x30e44323405a9d00) >> (bVar20 & 0x3f)] = uVar41;
    pUVar14[(ulong)(*(long *)((long)puVar25 + -1) * -0x30e44323405a9d00) >> (bVar20 & 0x3f)] =
         ((int)puVar25 + -1) - iVar30;
    do {
      uVar26 = uVar29;
      uVar29 = uVar26;
      src = puVar25;
      if (((int)uVar26 == 0) || ((int)*puVar25 != *(int *)((long)puVar25 - uVar26))) break;
      lVar24 = -uVar26;
      puVar27 = (ulong *)((long)puVar25 + 4);
      puVar38 = (ulong *)((long)puVar25 + lVar24 + 4);
      puVar32 = puVar27;
      if (puVar27 < puVar1) {
        if (*puVar38 == *puVar27) {
          lVar37 = 0;
          do {
            puVar32 = (ulong *)((long)puVar25 + lVar37 + 0xc);
            if (puVar1 <= puVar32) {
              puVar38 = (ulong *)((long)puVar25 + lVar24 + lVar37 + 0xc);
              puVar32 = (ulong *)((long)puVar25 + lVar37 + 0xc);
              goto LAB_005d006b;
            }
            uVar29 = *(ulong *)((long)puVar25 + lVar37 + lVar24 + 0xc);
            uVar18 = *puVar32;
            lVar37 = lVar37 + 8;
          } while (uVar29 == uVar18);
          uVar18 = uVar18 ^ uVar29;
          uVar29 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
            }
          }
          uVar29 = (uVar29 >> 3 & 0x1fffffff) + lVar37;
        }
        else {
          uVar18 = *puVar27 ^ *puVar38;
          uVar29 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
            }
          }
          uVar29 = uVar29 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_005d006b:
        if ((puVar32 < puVar2) && ((int)*puVar38 == (int)*puVar32)) {
          puVar32 = (ulong *)((long)puVar32 + 4);
          puVar38 = (ulong *)((long)puVar38 + 4);
        }
        if ((puVar32 < puVar3) && ((short)*puVar38 == (short)*puVar32)) {
          puVar32 = (ulong *)((long)puVar32 + 2);
          puVar38 = (ulong *)((long)puVar38 + 2);
        }
        if (puVar32 < puVar5) {
          puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar38 == (char)*puVar32));
        }
        uVar29 = (long)puVar32 - (long)puVar27;
      }
      uVar18 = *puVar25;
      UVar40 = (int)puVar25 - iVar30;
      pUVar14[uVar18 * -0x30e44323405a9d00 >> (bVar20 & 0x3f)] = UVar40;
      pUVar13[uVar18 * -0x30e44323485a9b9d >> (bVar19 & 0x3f)] = UVar40;
      if (puVar25 <= puVar4) {
        puVar27 = (ulong *)seqStore->lit;
        uVar18 = puVar25[1];
        *puVar27 = *puVar25;
        puVar27[1] = uVar18;
        psVar43 = seqStore->sequences;
      }
      psVar43->litLength = 0;
      psVar43->offset = 1;
      if (0xffff < uVar29 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar43 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar43->matchLength = (U16)(uVar29 + 1);
      psVar43 = psVar43 + 1;
      seqStore->sequences = psVar43;
      puVar25 = (ulong *)((long)puVar25 + uVar29 + 4);
      uVar29 = uVar45;
      uVar45 = uVar26;
      src = puVar25;
    } while (puVar25 <= puVar10);
  }
LAB_005d016c:
  uVar41 = (uint)uVar29;
  uVar44 = (uint)uVar45;
  if (puVar10 <= puVar25) goto LAB_005d257c;
  goto LAB_005cfab5;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_noDict);
    case 5 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_noDict);
    case 6 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_noDict);
    case 7 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_noDict);
    }
}